

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::dumpBuffer
          (CLIntercept *this,string *name,uint64_t enqueueCounter,cl_mem memobj,
          cl_command_queue command_queue,void *ptr,size_t offset,size_t size)

{
  CBufferInfoMap *this_00;
  size_t size_00;
  iterator iVar1;
  mapped_type *pmVar2;
  mapped_type_conflict *pmVar3;
  void *ptr_00;
  allocator local_171;
  cl_mem memobj_local;
  string fileName;
  char bufferName [256];
  
  memobj_local = memobj;
  std::mutex::lock(&this->m_Mutex);
  this_00 = &this->m_BufferInfoMap;
  iVar1 = std::
          _Rb_tree<_cl_mem_*,_std::pair<_cl_mem_*const,_unsigned_long>,_std::_Select1st<std::pair<_cl_mem_*const,_unsigned_long>_>,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
          ::find(&this_00->_M_t,&memobj_local);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)&fileName,"",(allocator *)bufferName);
    std::__cxx11::string::string((string *)bufferName,sc_DumpDirectoryName,&local_171);
    OS::Services_Common::GetDumpDirectoryName
              (&(this->m_OS).super_Services_Common,(string *)bufferName,&fileName);
    std::__cxx11::string::~string((string *)bufferName);
    std::__cxx11::string::append((char *)&fileName);
    OS::Services_Common::MakeDumpDirectories(&(this->m_OS).super_Services_Common,&fileName);
    std::__cxx11::string::append((string *)&fileName);
    bufferName._0_8_ = memobj_local;
    pmVar2 = std::
             map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
             ::operator[](&this->m_MemAllocNumberMap,(key_type *)bufferName);
    snprintf(bufferName,0x100,"%04u",(ulong)*pmVar2);
    std::__cxx11::string::append((char *)&fileName);
    std::__cxx11::string::append((char *)&fileName);
    snprintf(bufferName,0x100,"%04zu",offset);
    std::__cxx11::string::append((char *)&fileName);
    std::__cxx11::string::append((char *)&fileName);
    snprintf(bufferName,0x100,"%04u",enqueueCounter & 0xffffffff);
    std::__cxx11::string::append((char *)&fileName);
    std::__cxx11::string::append((char *)&fileName);
    std::__cxx11::string::append((char *)&fileName);
    if (size == 0 || ptr == (void *)0x0) {
      std::
      _Rb_tree<_cl_mem_*,_std::pair<_cl_mem_*const,_unsigned_long>,_std::_Select1st<std::pair<_cl_mem_*const,_unsigned_long>_>,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
      ::find(&this_00->_M_t,&memobj_local);
      pmVar3 = std::
               map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
               ::operator[](this_00,&memobj_local);
      size_00 = *pmVar3;
      bufferName._0_8_ = bufferName._0_8_ & 0xffffffff00000000;
      ptr_00 = (*(this->m_Dispatch).clEnqueueMapBuffer)
                         (command_queue,memobj_local,1,1,0,size_00,0,(cl_event *)0x0,(cl_event *)0x0
                          ,(cl_int *)bufferName);
      if (bufferName._0_4_ == 0) {
        dumpMemoryToFile(this,&fileName,(this->m_Config).DumpBufferHashes,ptr_00,size_00);
        (*(this->m_Dispatch).clEnqueueUnmapMemObject)
                  (command_queue,memobj_local,ptr_00,0,(cl_event *)0x0,(cl_event *)0x0);
      }
    }
    else {
      dumpMemoryToFile(this,&fileName,(this->m_Config).DumpBufferHashes,ptr,size);
    }
    std::__cxx11::string::~string((string *)&fileName);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::dumpBuffer(
    const std::string& name,
    const uint64_t enqueueCounter,
    cl_mem memobj,
    cl_command_queue command_queue,
    void* ptr,
    size_t offset,
    size_t size )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() )
    {
        std::string fileName = "";

        // Get the dump directory name.
        {
            OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
            fileName += "/memDumpCreateMapUnmap/";
        }

        // Now make directories as appropriate.
        {
            OS().MakeDumpDirectories( fileName );
        }

        fileName += name;

        // Add the buffer number to the file name
        {
            unsigned int        number = m_MemAllocNumberMap[ memobj ];

            char    bufferName[ MAX_PATH ];

            CLI_SPRINTF( bufferName, MAX_PATH, "%04u", number );

            fileName += "_Buffer_";
            fileName += bufferName;
        }

        // Add the offset to the file name
        {
            char    offsetName[ MAX_PATH ];

            CLI_SPRINTF( offsetName, MAX_PATH, "%04zu",
                offset );

            fileName += "_Offset_";
            fileName += offsetName;
        }

        // Add the enqueue count to file name
        {
            char    enqueueCount[ MAX_PATH ];

            CLI_SPRINTF( enqueueCount, MAX_PATH, "%04u",
                (unsigned int)enqueueCounter );

            fileName += "_Enqueue_";
            fileName += enqueueCount;
        }

        // Add extension to file name
        {
            fileName += ".bin";
        }

        // Dump the buffer contents to the file.
        // There are two possibilities:
        // 1) We have a pointer and size already.  This might happen
        //    when the buffer is being created or was just mapped.
        //    In this case, we can just write this to the file.
        // 2) We have no pointer or size.  This usually happens when
        //    the buffer is being unmapped.  In this case, we'll
        //    map and dump the entire buffer.
        if( ptr != NULL && size != 0 )
        {
            dumpMemoryToFile(
                fileName,
                config().DumpBufferHashes,
                ptr,
                size );
        }
        else
        {
            // We should have checked this already...
            CLI_ASSERT( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() );

            size_t  size = m_BufferInfoMap[ memobj ];

            cl_int  error = CL_SUCCESS;
            ptr = dispatch().clEnqueueMapBuffer(
                command_queue,
                memobj,
                CL_TRUE,
                CL_MAP_READ,
                0,
                size,
                0,
                NULL,
                NULL,
                &error );
            if( error == CL_SUCCESS )
            {
                dumpMemoryToFile(
                    fileName,
                    config().DumpBufferHashes,
                    ptr,
                    size );

                dispatch().clEnqueueUnmapMemObject(
                    command_queue,
                    memobj,
                    ptr,
                    0,
                    NULL,
                    NULL );
            }
        }
    }
}